

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O0

void __thiscall irr::video::CNullDriver::deleteShaderMaterial(CNullDriver *this,s32 material)

{
  u32 uVar1;
  SMaterialRenderer *pSVar2;
  IMaterialRenderer *this_00;
  uint in_ESI;
  SMaterialRenderer *ref;
  u32 idx;
  undefined4 in_stack_ffffffffffffffc8;
  u32 in_stack_ffffffffffffffcc;
  array<irr::video::CNullDriver::SMaterialRenderer> *in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffe8;
  u32 index;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  index = (u32)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  if ((4 < in_ESI) &&
     (uVar3 = in_ESI, uVar5 = in_ESI,
     uVar1 = core::array<irr::video::CNullDriver::SMaterialRenderer>::size
                       ((array<irr::video::CNullDriver::SMaterialRenderer> *)0x30de2f),
     in_ESI < uVar1)) {
    uVar4 = uVar3;
    uVar1 = core::array<irr::video::CNullDriver::SMaterialRenderer>::size
                      ((array<irr::video::CNullDriver::SMaterialRenderer> *)0x30de57);
    if (uVar3 == uVar1 - 1) {
      pSVar2 = core::array<irr::video::CNullDriver::SMaterialRenderer>::operator[]
                         (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      if (pSVar2->Renderer != (IMaterialRenderer *)0x0) {
        core::array<irr::video::CNullDriver::SMaterialRenderer>::operator[]
                  (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
        IReferenceCounted::drop
                  ((IReferenceCounted *)
                   CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
      core::array<irr::video::CNullDriver::SMaterialRenderer>::erase
                ((array<irr::video::CNullDriver::SMaterialRenderer> *)CONCAT44(uVar5,uVar4),index);
    }
    else {
      pSVar2 = core::array<irr::video::CNullDriver::SMaterialRenderer>::operator[]
                         (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      if (pSVar2->Renderer != (IMaterialRenderer *)0x0) {
        IReferenceCounted::drop
                  ((IReferenceCounted *)
                   CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
      this_00 = (IMaterialRenderer *)operator_new(0x20);
      anon_unknown_48::CDummyMaterialRenderer::CDummyMaterialRenderer
                ((CDummyMaterialRenderer *)this_00);
      pSVar2->Renderer = this_00;
      core::string<char>::clear
                ((string<char> *)CONCAT44(uVar5,uVar4),SUB81((ulong)pSVar2 >> 0x38,0));
    }
  }
  return;
}

Assistant:

void CNullDriver::deleteShaderMaterial(s32 material)
{
	const u32 idx = (u32)material;
	if (idx < numBuiltInMaterials || idx >= MaterialRenderers.size())
		return;

	// if this is the last material we can drop it without consequence
	if (idx == MaterialRenderers.size() - 1) {
		if (MaterialRenderers[idx].Renderer)
			MaterialRenderers[idx].Renderer->drop();
		MaterialRenderers.erase(idx);
		return;
	}
	// otherwise replace with a dummy renderer, we have to preserve the IDs
	auto &ref = MaterialRenderers[idx];
	if (ref.Renderer)
		ref.Renderer->drop();
	ref.Renderer = new CDummyMaterialRenderer();
	ref.Name.clear();
}